

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O3

Vec4 tcu::astc::getBlockTestTypeColorScale(BlockTestType testType)

{
  undefined4 *in_RDI;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 in_XMM1_Qa;
  Vec4 VVar5;
  
  if (testType == BLOCK_TEST_TYPE_VOID_EXTENT_HDR) {
    uVar1 = 0x37001002;
    uVar2 = 0x37001002;
    uVar3 = 0x37001002;
    uVar4 = 0x37001002;
  }
  else if (testType == BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15) {
    uVar1 = 0x37801002;
    uVar2 = 0x37801002;
    uVar3 = 0x37801002;
    uVar4 = 0x3f800000;
  }
  else if (testType == BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15) {
    uVar1 = 0x37801002;
    uVar2 = 0x37801002;
    uVar3 = 0x37801002;
    uVar4 = 0x37801002;
  }
  else {
    uVar1 = 0x3f800000;
    uVar2 = 0x3f800000;
    uVar3 = 0x3f800000;
    uVar4 = 0x3f800000;
  }
  *in_RDI = uVar1;
  in_RDI[1] = uVar2;
  in_RDI[2] = uVar3;
  in_RDI[3] = uVar4;
  VVar5.m_data[1] = (float)uVar2;
  VVar5.m_data[0] = (float)uVar1;
  VVar5.m_data._8_8_ = in_XMM1_Qa;
  return (Vec4)VVar5.m_data;
}

Assistant:

Vec4 getBlockTestTypeColorScale (BlockTestType testType)
{
	switch (testType)
	{
		case tcu::astc::BLOCK_TEST_TYPE_VOID_EXTENT_HDR:			return Vec4(0.5f/65504.0f);
		case tcu::astc::BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15:	return Vec4(1.0f/65504.0f, 1.0f/65504.0f, 1.0f/65504.0f, 1.0f);
		case tcu::astc::BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15:		return Vec4(1.0f/65504.0f);
		default:													return Vec4(1.0f);
	}
}